

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_expr.hpp
# Opt level: O3

self_type * __thiscall
viennamath::rt_vector_expr<viennamath::rt_expression_interface<double>_>::operator-
          (self_type *__return_storage_ptr__,
          rt_vector_expr<viennamath::rt_expression_interface<double>_> *this,self_type *other)

{
  rt_expression_interface<double> *prVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  op_interface<viennamath::rt_expression_interface<double>_> *poVar4;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined8 in_RCX;
  void *__child_stack;
  long lVar5;
  __fn *__fn;
  void *in_R8;
  ulong uVar6;
  pointer prVar7;
  rt_binary_expr<viennamath::rt_expression_interface<double>_> local_58;
  rt_vector_expr<viennamath::rt_expression_interface<double>_> *local_38;
  
  lVar5 = (long)(this->
                super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                ).
                super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->
                super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                ).
                super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_38 = this;
  if (lVar5 == (long)(other->
                     super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                     ).
                     super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(other->
                     super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                     ).
                     super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) {
    __fn = (__fn *)(lVar5 >> 3);
    rt_vector_expr(__return_storage_ptr__,(size_type)__fn);
    prVar7 = (other->
             super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
             ).
             super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((other->
        super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
        ).
        super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != prVar7) {
      uVar6 = 0;
      do {
        iVar2 = (*((local_38->
                   super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                   ).
                   super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar6].rt_expr_._M_ptr)->
                  _vptr_rt_expression_interface[2])();
        poVar4 = (op_interface<viennamath::rt_expression_interface<double>_> *)operator_new(8);
        poVar4->_vptr_op_interface = (_func_int **)&PTR__op_interface_00116c90;
        iVar3 = (*(prVar7[uVar6].rt_expr_._M_ptr)->_vptr_rt_expression_interface[2])();
        local_58.rhs_._M_ptr = (rt_expression_interface<double> *)CONCAT44(extraout_var_00,iVar3);
        local_58.super_rt_expression_interface<double>._vptr_rt_expression_interface =
             (_func_int **)&PTR__rt_binary_expr_00116490;
        prVar7 = (__return_storage_ptr__->
                 super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                 ).
                 super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_58.lhs_._M_ptr = (rt_expression_interface<double> *)CONCAT44(extraout_var,iVar2);
        local_58.op_._M_ptr = poVar4;
        iVar2 = rt_binary_expr<viennamath::rt_expression_interface<double>_>::clone
                          (&local_58,__fn,__child_stack,(int)in_RCX,in_R8);
        prVar1 = prVar7[uVar6].rt_expr_._M_ptr;
        if (prVar1 != (rt_expression_interface<double> *)CONCAT44(extraout_var_01,iVar2)) {
          if (prVar1 != (rt_expression_interface<double> *)0x0) {
            (*prVar1->_vptr_rt_expression_interface[1])();
          }
          prVar7[uVar6].rt_expr_._M_ptr =
               (rt_expression_interface<double> *)CONCAT44(extraout_var_01,iVar2);
        }
        local_58.super_rt_expression_interface<double>._vptr_rt_expression_interface =
             (_func_int **)&PTR__rt_binary_expr_00116490;
        if (local_58.rhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
          (*(local_58.rhs_._M_ptr)->_vptr_rt_expression_interface[1])();
        }
        if (local_58.op_._M_ptr != (op_interface<viennamath::rt_expression_interface<double>_> *)0x0
           ) {
          (*(local_58.op_._M_ptr)->_vptr_op_interface[1])();
        }
        if (local_58.lhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
          (*(local_58.lhs_._M_ptr)->_vptr_rt_expression_interface[1])();
        }
        uVar6 = uVar6 + 1;
        prVar7 = (other->
                 super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                 ).
                 super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      } while (uVar6 < (ulong)((long)(other->
                                     super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                                     ).
                                     super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)prVar7 >> 3)
              );
    }
    return __return_storage_ptr__;
  }
  __assert_fail("BaseType::size() == other.size() && \"Expression vector dimensions mismatch\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/viennamath[P]viennamath-dev/viennamath/runtime/vector_expr.hpp"
                ,0x4b,
                "self_type viennamath::rt_vector_expr<>::operator-(const self_type &) const [InterfaceType = viennamath::rt_expression_interface<double>]"
               );
}

Assistant:

self_type operator-(self_type const & other) const
      {
        assert(BaseType::size() == other.size() && "Expression vector dimensions mismatch");

        self_type result(other.size());
        for (std::size_t i=0; i<other.size(); ++i)
          result[i] = (*this)[i] - other[i];

        return result;
      }